

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::InstanceArrayIntersectorKMB<8>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [32];
  uint uVar26;
  ulong uVar27;
  Primitive_conflict4 *prim;
  ulong *puVar28;
  bool bVar29;
  byte bVar30;
  ulong uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  vbool<8>_conflict valid_leaf;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  vbool<8>_conflict local_272a;
  Precalculations local_2729;
  RayQueryContext *local_2728;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  ulong local_2620 [244];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2620[3] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2620[3] != 8) {
    auVar35 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
    uVar27 = vpcmpeqd_avx512vl(auVar35,(undefined1  [32])valid_i->field_0);
    bVar30 = (byte)uVar27;
    if (bVar30 != 0) {
      auVar35 = *(undefined1 (*) [32])(ray + 0x80);
      auVar32 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar33 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar37._8_4_ = 0x7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar37._12_4_ = 0x7fffffff;
      auVar37._16_4_ = 0x7fffffff;
      auVar37._20_4_ = 0x7fffffff;
      auVar37._24_4_ = 0x7fffffff;
      auVar37._28_4_ = 0x7fffffff;
      auVar34 = vandps_avx(auVar35,auVar37);
      auVar39._8_4_ = 0x219392ef;
      auVar39._0_8_ = 0x219392ef219392ef;
      auVar39._12_4_ = 0x219392ef;
      auVar39._16_4_ = 0x219392ef;
      auVar39._20_4_ = 0x219392ef;
      auVar39._24_4_ = 0x219392ef;
      auVar39._28_4_ = 0x219392ef;
      uVar20 = vcmpps_avx512vl(auVar34,auVar39,1);
      bVar29 = (bool)((byte)uVar20 & 1);
      auVar34._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar35._0_4_;
      bVar29 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar34._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar35._4_4_;
      bVar29 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar34._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar35._8_4_;
      bVar29 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar34._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar35._12_4_;
      bVar29 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar34._16_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar35._16_4_;
      bVar29 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar34._20_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar35._20_4_;
      bVar29 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar34._24_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar35._24_4_;
      bVar29 = SUB81(uVar20 >> 7,0);
      auVar34._28_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar35._28_4_;
      auVar35 = vandps_avx(auVar32,auVar37);
      uVar20 = vcmpps_avx512vl(auVar35,auVar39,1);
      bVar29 = (bool)((byte)uVar20 & 1);
      auVar36._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar32._0_4_;
      bVar29 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar32._4_4_;
      bVar29 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar32._8_4_;
      bVar29 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar32._12_4_;
      bVar29 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar36._16_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar32._16_4_;
      bVar29 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar36._20_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar32._20_4_;
      bVar29 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar36._24_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar32._24_4_;
      bVar29 = SUB81(uVar20 >> 7,0);
      auVar36._28_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar32._28_4_;
      auVar35 = vandps_avx(auVar33,auVar37);
      uVar20 = vcmpps_avx512vl(auVar35,auVar39,1);
      bVar29 = (bool)((byte)uVar20 & 1);
      auVar35._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._0_4_;
      bVar29 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar35._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._4_4_;
      bVar29 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar35._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._8_4_;
      bVar29 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar35._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._12_4_;
      bVar29 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar35._16_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._16_4_;
      bVar29 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar35._20_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._20_4_;
      bVar29 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar35._24_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._24_4_;
      bVar29 = SUB81(uVar20 >> 7,0);
      auVar35._28_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar33._28_4_;
      auVar32 = vrcp14ps_avx512vl(auVar34);
      auVar40._8_4_ = 0x3f800000;
      auVar40._0_8_ = 0x3f8000003f800000;
      auVar40._12_4_ = 0x3f800000;
      auVar40._16_4_ = 0x3f800000;
      auVar40._20_4_ = 0x3f800000;
      auVar40._24_4_ = 0x3f800000;
      auVar40._28_4_ = 0x3f800000;
      auVar11 = vfnmadd213ps_fma(auVar34,auVar32,auVar40);
      auVar33 = vrcp14ps_avx512vl(auVar36);
      auVar12 = vfnmadd213ps_fma(auVar36,auVar33,auVar40);
      auVar34 = vrcp14ps_avx512vl(auVar35);
      auVar13 = vfnmadd213ps_fma(auVar35,auVar34,auVar40);
      auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar32,auVar32);
      auVar52 = ZEXT1664(auVar11);
      auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar33,auVar33);
      auVar53 = ZEXT1664(auVar12);
      auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar34,auVar34);
      auVar54 = ZEXT1664(auVar13);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar55 = ZEXT3264(local_1e80);
      auVar35 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT832(0) << 0x20);
      local_26c0._0_4_ = (uint)(bVar30 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar30 & 1) * 0x7f800000
      ;
      bVar29 = (bool)((byte)(uVar27 >> 1) & 1);
      local_26c0._4_4_ = (uint)bVar29 * auVar35._4_4_ | (uint)!bVar29 * 0x7f800000;
      bVar29 = (bool)((byte)(uVar27 >> 2) & 1);
      local_26c0._8_4_ = (uint)bVar29 * auVar35._8_4_ | (uint)!bVar29 * 0x7f800000;
      bVar29 = (bool)((byte)(uVar27 >> 3) & 1);
      local_26c0._12_4_ = (uint)bVar29 * auVar35._12_4_ | (uint)!bVar29 * 0x7f800000;
      bVar29 = (bool)((byte)(uVar27 >> 4) & 1);
      local_26c0._16_4_ = (uint)bVar29 * auVar35._16_4_ | (uint)!bVar29 * 0x7f800000;
      bVar29 = (bool)((byte)(uVar27 >> 5) & 1);
      local_26c0._20_4_ = (uint)bVar29 * auVar35._20_4_ | (uint)!bVar29 * 0x7f800000;
      bVar29 = (bool)((byte)(uVar27 >> 6) & 1);
      local_26c0._24_4_ = (uint)bVar29 * auVar35._24_4_ | (uint)!bVar29 * 0x7f800000;
      bVar29 = SUB81(uVar27 >> 7,0);
      local_26c0._28_4_ = (uint)bVar29 * auVar35._28_4_ | (uint)!bVar29 * 0x7f800000;
      auVar56 = ZEXT3264(local_26c0);
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar32 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT832(0) << 0x20);
      bVar29 = (bool)((byte)(uVar27 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar27 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar27 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar27 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar27 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar27 >> 6) & 1);
      bVar8 = SUB81(uVar27 >> 7,0);
      auVar57 = ZEXT3264(CONCAT428((uint)bVar8 * auVar32._28_4_ | (uint)!bVar8 * auVar35._28_4_,
                                   CONCAT424((uint)bVar7 * auVar32._24_4_ |
                                             (uint)!bVar7 * auVar35._24_4_,
                                             CONCAT420((uint)bVar6 * auVar32._20_4_ |
                                                       (uint)!bVar6 * auVar35._20_4_,
                                                       CONCAT416((uint)bVar5 * auVar32._16_4_ |
                                                                 (uint)!bVar5 * auVar35._16_4_,
                                                                 CONCAT412((uint)bVar4 *
                                                                           auVar32._12_4_ |
                                                                           (uint)!bVar4 *
                                                                           auVar35._12_4_,
                                                                           CONCAT48((uint)bVar3 *
                                                                                    auVar32._8_4_ |
                                                                                    (uint)!bVar3 *
                                                                                    auVar35._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar29 * auVar32._4_4_ |
                                                  (uint)!bVar29 * auVar35._4_4_,
                                                  (uint)(bVar30 & 1) * auVar32._0_4_ |
                                                  (uint)!(bool)(bVar30 & 1) * auVar35._0_4_))))))));
      puVar28 = local_2620 + 4;
      auVar35 = *(undefined1 (*) [32])ray;
      auVar33._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
      auVar33._8_4_ = auVar35._8_4_ ^ 0x80000000;
      auVar33._12_4_ = auVar35._12_4_ ^ 0x80000000;
      auVar33._16_4_ = auVar35._16_4_ ^ 0x80000000;
      auVar33._20_4_ = auVar35._20_4_ ^ 0x80000000;
      auVar33._24_4_ = auVar35._24_4_ ^ 0x80000000;
      auVar33._28_4_ = auVar35._28_4_ ^ 0x80000000;
      pauVar25 = (undefined1 (*) [32])local_1e40;
      local_2660 = ZEXT1632(auVar11);
      local_26e0 = vmulps_avx512vl(local_2660,auVar33);
      auVar58 = ZEXT3264(local_26e0);
      auVar35 = *(undefined1 (*) [32])(ray + 0x20);
      auVar38._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
      auVar38._8_4_ = auVar35._8_4_ ^ 0x80000000;
      auVar38._12_4_ = auVar35._12_4_ ^ 0x80000000;
      auVar38._16_4_ = auVar35._16_4_ ^ 0x80000000;
      auVar38._20_4_ = auVar35._20_4_ ^ 0x80000000;
      auVar38._24_4_ = auVar35._24_4_ ^ 0x80000000;
      auVar38._28_4_ = auVar35._28_4_ ^ 0x80000000;
      auVar35 = *(undefined1 (*) [32])(ray + 0x40);
      auVar32._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
      auVar32._8_4_ = auVar35._8_4_ ^ 0x80000000;
      auVar32._12_4_ = auVar35._12_4_ ^ 0x80000000;
      auVar32._16_4_ = auVar35._16_4_ ^ 0x80000000;
      auVar32._20_4_ = auVar35._20_4_ ^ 0x80000000;
      auVar32._24_4_ = auVar35._24_4_ ^ 0x80000000;
      auVar32._28_4_ = auVar35._28_4_ ^ 0x80000000;
      local_2680 = ZEXT1632(auVar12);
      local_2700 = vmulps_avx512vl(local_2680,auVar38);
      auVar59 = ZEXT3264(local_2700);
      local_26a0 = ZEXT1632(auVar13);
      local_2720 = vmulps_avx512vl(local_26a0,auVar32);
      auVar60 = ZEXT3264(local_2720);
      local_2620[2] = 0xfffffffffffffff8;
      local_1e60 = local_26c0;
      local_2728 = context;
LAB_01d17621:
      uVar27 = puVar28[-1];
      if (uVar27 != 0xfffffffffffffff8) {
        puVar28 = puVar28 + -1;
        pauVar1 = pauVar25 + -1;
        auVar44 = ZEXT3264(*pauVar1);
        pauVar25 = pauVar25 + -1;
        local_2640 = auVar57._0_32_;
        uVar9 = vcmpps_avx512vl(*pauVar1,local_2640,1);
        if ((char)uVar9 != '\0') {
          while( true ) {
            uVar26 = (uint)uVar27;
            if ((uVar27 & 8) != 0) break;
            uVar21 = uVar27 & 0xfffffffffffffff0;
            auVar45 = ZEXT3264(auVar55._0_32_);
            uVar20 = 0;
            uVar27 = 8;
            for (lVar22 = -0x10;
                (auVar35 = auVar45._0_32_, lVar22 != 0 &&
                (uVar23 = *(ulong *)(uVar21 + 0x20 + lVar22 * 2), uVar23 != 8)); lVar22 = lVar22 + 4
                ) {
              uVar2 = *(undefined4 *)(uVar21 + 0x90 + lVar22);
              auVar46._4_4_ = uVar2;
              auVar46._0_4_ = uVar2;
              auVar46._8_4_ = uVar2;
              auVar46._12_4_ = uVar2;
              auVar46._16_4_ = uVar2;
              auVar46._20_4_ = uVar2;
              auVar46._24_4_ = uVar2;
              auVar46._28_4_ = uVar2;
              auVar32 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar2 = *(undefined4 *)(uVar21 + 0x30 + lVar22);
              auVar41._4_4_ = uVar2;
              auVar41._0_4_ = uVar2;
              auVar41._8_4_ = uVar2;
              auVar41._12_4_ = uVar2;
              auVar41._16_4_ = uVar2;
              auVar41._20_4_ = uVar2;
              auVar41._24_4_ = uVar2;
              auVar41._28_4_ = uVar2;
              auVar33 = vfmadd213ps_avx512vl(auVar46,auVar32,auVar41);
              uVar2 = *(undefined4 *)(uVar21 + 0xb0 + lVar22);
              auVar47._4_4_ = uVar2;
              auVar47._0_4_ = uVar2;
              auVar47._8_4_ = uVar2;
              auVar47._12_4_ = uVar2;
              auVar47._16_4_ = uVar2;
              auVar47._20_4_ = uVar2;
              auVar47._24_4_ = uVar2;
              auVar47._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar21 + 0x50 + lVar22);
              auVar42._4_4_ = uVar2;
              auVar42._0_4_ = uVar2;
              auVar42._8_4_ = uVar2;
              auVar42._12_4_ = uVar2;
              auVar42._16_4_ = uVar2;
              auVar42._20_4_ = uVar2;
              auVar42._24_4_ = uVar2;
              auVar42._28_4_ = uVar2;
              auVar34 = vfmadd213ps_avx512vl(auVar47,auVar32,auVar42);
              uVar2 = *(undefined4 *)(uVar21 + 0xd0 + lVar22);
              auVar48._4_4_ = uVar2;
              auVar48._0_4_ = uVar2;
              auVar48._8_4_ = uVar2;
              auVar48._12_4_ = uVar2;
              auVar48._16_4_ = uVar2;
              auVar48._20_4_ = uVar2;
              auVar48._24_4_ = uVar2;
              auVar48._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar21 + 0x70 + lVar22);
              auVar14._4_4_ = uVar2;
              auVar14._0_4_ = uVar2;
              auVar14._8_4_ = uVar2;
              auVar14._12_4_ = uVar2;
              auVar14._16_4_ = uVar2;
              auVar14._20_4_ = uVar2;
              auVar14._24_4_ = uVar2;
              auVar14._28_4_ = uVar2;
              auVar36 = vfmadd213ps_avx512vl(auVar48,auVar32,auVar14);
              uVar2 = *(undefined4 *)(uVar21 + 0xa0 + lVar22);
              auVar49._4_4_ = uVar2;
              auVar49._0_4_ = uVar2;
              auVar49._8_4_ = uVar2;
              auVar49._12_4_ = uVar2;
              auVar49._16_4_ = uVar2;
              auVar49._20_4_ = uVar2;
              auVar49._24_4_ = uVar2;
              auVar49._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar21 + 0x40 + lVar22);
              auVar15._4_4_ = uVar2;
              auVar15._0_4_ = uVar2;
              auVar15._8_4_ = uVar2;
              auVar15._12_4_ = uVar2;
              auVar15._16_4_ = uVar2;
              auVar15._20_4_ = uVar2;
              auVar15._24_4_ = uVar2;
              auVar15._28_4_ = uVar2;
              auVar37 = vfmadd213ps_avx512vl(auVar49,auVar32,auVar15);
              uVar2 = *(undefined4 *)(uVar21 + 0xc0 + lVar22);
              auVar50._4_4_ = uVar2;
              auVar50._0_4_ = uVar2;
              auVar50._8_4_ = uVar2;
              auVar50._12_4_ = uVar2;
              auVar50._16_4_ = uVar2;
              auVar50._20_4_ = uVar2;
              auVar50._24_4_ = uVar2;
              auVar50._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar21 + 0x60 + lVar22);
              auVar16._4_4_ = uVar2;
              auVar16._0_4_ = uVar2;
              auVar16._8_4_ = uVar2;
              auVar16._12_4_ = uVar2;
              auVar16._16_4_ = uVar2;
              auVar16._20_4_ = uVar2;
              auVar16._24_4_ = uVar2;
              auVar16._28_4_ = uVar2;
              auVar38 = vfmadd213ps_avx512vl(auVar50,auVar32,auVar16);
              uVar2 = *(undefined4 *)(uVar21 + 0xe0 + lVar22);
              auVar51._4_4_ = uVar2;
              auVar51._0_4_ = uVar2;
              auVar51._8_4_ = uVar2;
              auVar51._12_4_ = uVar2;
              auVar51._16_4_ = uVar2;
              auVar51._20_4_ = uVar2;
              auVar51._24_4_ = uVar2;
              auVar51._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar21 + 0x80 + lVar22);
              auVar17._4_4_ = uVar2;
              auVar17._0_4_ = uVar2;
              auVar17._8_4_ = uVar2;
              auVar17._12_4_ = uVar2;
              auVar17._16_4_ = uVar2;
              auVar17._20_4_ = uVar2;
              auVar17._24_4_ = uVar2;
              auVar17._28_4_ = uVar2;
              auVar39 = vfmadd213ps_avx512vl(auVar51,auVar32,auVar17);
              auVar40 = vfmadd213ps_avx512vl(auVar33,auVar52._0_32_,auVar58._0_32_);
              auVar41 = vfmadd213ps_avx512vl(auVar34,auVar53._0_32_,auVar59._0_32_);
              auVar42 = vfmadd213ps_avx512vl(auVar36,auVar54._0_32_,auVar60._0_32_);
              auVar36 = vfmadd213ps_avx512vl(auVar37,auVar52._0_32_,auVar58._0_32_);
              auVar37 = vfmadd213ps_avx512vl(auVar38,auVar53._0_32_,auVar59._0_32_);
              auVar38 = vfmadd213ps_avx512vl(auVar39,auVar54._0_32_,auVar60._0_32_);
              auVar33 = vpminsd_avx2(auVar40,auVar36);
              auVar34 = vpminsd_avx2(auVar41,auVar37);
              auVar33 = vpmaxsd_avx2(auVar33,auVar34);
              auVar34 = vpminsd_avx2(auVar42,auVar38);
              auVar33 = vpmaxsd_avx2(auVar33,auVar34);
              auVar34 = vpmaxsd_avx2(auVar40,auVar36);
              auVar36 = vpmaxsd_avx2(auVar41,auVar37);
              auVar37 = vpminsd_avx2(auVar34,auVar36);
              auVar34 = vpmaxsd_avx2(auVar42,auVar38);
              auVar36 = vpmaxsd_avx2(auVar33,auVar56._0_32_);
              auVar34 = vpminsd_avx512vl(auVar34,local_2640);
              auVar34 = vpminsd_avx2(auVar37,auVar34);
              uVar31 = vcmpps_avx512vl(auVar36,auVar34,2);
              if ((uVar26 & 7) == 6) {
                uVar2 = *(undefined4 *)(uVar21 + 0xf0 + lVar22);
                auVar18._4_4_ = uVar2;
                auVar18._0_4_ = uVar2;
                auVar18._8_4_ = uVar2;
                auVar18._12_4_ = uVar2;
                auVar18._16_4_ = uVar2;
                auVar18._20_4_ = uVar2;
                auVar18._24_4_ = uVar2;
                auVar18._28_4_ = uVar2;
                uVar24 = vcmpps_avx512vl(auVar32,auVar18,0xd);
                uVar2 = *(undefined4 *)(uVar21 + 0x100 + lVar22);
                auVar19._4_4_ = uVar2;
                auVar19._0_4_ = uVar2;
                auVar19._8_4_ = uVar2;
                auVar19._12_4_ = uVar2;
                auVar19._16_4_ = uVar2;
                auVar19._20_4_ = uVar2;
                auVar19._24_4_ = uVar2;
                auVar19._28_4_ = uVar2;
                uVar10 = vcmpps_avx512vl(auVar32,auVar19,1);
                uVar31 = uVar31 & uVar24 & uVar10;
              }
              uVar24 = vcmpps_avx512vl(local_2640,auVar44._0_32_,6);
              uVar31 = uVar31 & uVar24;
              if ((byte)uVar31 != 0) {
                auVar33 = vblendmps_avx512vl(auVar55._0_32_,auVar33);
                bVar29 = (bool)((byte)uVar31 & 1);
                auVar43._0_4_ = (uint)bVar29 * auVar33._0_4_ | (uint)!bVar29 * auVar32._0_4_;
                bVar29 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar43._4_4_ = (uint)bVar29 * auVar33._4_4_ | (uint)!bVar29 * auVar32._4_4_;
                bVar29 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar43._8_4_ = (uint)bVar29 * auVar33._8_4_ | (uint)!bVar29 * auVar32._8_4_;
                bVar29 = (bool)((byte)(uVar31 >> 3) & 1);
                auVar43._12_4_ = (uint)bVar29 * auVar33._12_4_ | (uint)!bVar29 * auVar32._12_4_;
                bVar29 = (bool)((byte)(uVar31 >> 4) & 1);
                auVar43._16_4_ = (uint)bVar29 * auVar33._16_4_ | (uint)!bVar29 * auVar32._16_4_;
                bVar29 = (bool)((byte)(uVar31 >> 5) & 1);
                auVar43._20_4_ = (uint)bVar29 * auVar33._20_4_ | (uint)!bVar29 * auVar32._20_4_;
                bVar29 = (bool)((byte)(uVar31 >> 6) & 1);
                auVar43._24_4_ = (uint)bVar29 * auVar33._24_4_ | (uint)!bVar29 * auVar32._24_4_;
                bVar29 = SUB81(uVar31 >> 7,0);
                auVar43._28_4_ = (uint)bVar29 * auVar33._28_4_ | (uint)!bVar29 * auVar32._28_4_;
                uVar9 = vcmpps_avx512vl(auVar43,auVar35,1);
                uVar31 = uVar27;
                uVar24 = uVar23;
                auVar32 = auVar43;
                if (((char)uVar9 == '\0') ||
                   (uVar31 = uVar23, uVar24 = uVar27, auVar32 = auVar35, auVar35 = auVar43,
                   uVar27 != 8)) {
                  auVar43 = auVar35;
                  uVar20 = uVar20 + 1;
                  *puVar28 = uVar24;
                  puVar28 = puVar28 + 1;
                  *pauVar25 = auVar32;
                  pauVar25 = pauVar25 + 1;
                  uVar23 = uVar31;
                }
                auVar45 = ZEXT3264(auVar43);
                uVar27 = uVar23;
              }
            }
            if (uVar27 == 8) goto LAB_01d17621;
            auVar44 = ZEXT3264(auVar35);
            if (1 < uVar20) {
              auVar33 = pauVar25[-2];
              auVar32 = pauVar25[-1];
              uVar9 = vcmpps_avx512vl(auVar33,auVar32,1);
              auVar34 = auVar32;
              if ((char)uVar9 != '\0') {
                pauVar25[-2] = auVar32;
                pauVar25[-1] = auVar33;
                auVar11 = vpermilps_avx(*(undefined1 (*) [16])(puVar28 + -2),0x4e);
                *(undefined1 (*) [16])(puVar28 + -2) = auVar11;
                auVar34 = auVar33;
                auVar33 = auVar32;
              }
              auVar44 = ZEXT3264(auVar35);
              if (uVar20 != 2) {
                auVar32 = pauVar25[-3];
                uVar9 = vcmpps_avx512vl(auVar32,auVar34,1);
                if ((char)uVar9 != '\0') {
                  pauVar25[-3] = auVar34;
                  pauVar25[-1] = auVar32;
                  uVar20 = puVar28[-3];
                  puVar28[-3] = puVar28[-1];
                  puVar28[-1] = uVar20;
                  auVar32 = auVar34;
                }
                uVar9 = vcmpps_avx512vl(auVar32,auVar33,1);
                auVar44 = ZEXT3264(auVar35);
                if ((char)uVar9 != '\0') {
                  pauVar25[-3] = auVar33;
                  pauVar25[-2] = auVar32;
                  auVar11 = vpermilps_avx(*(undefined1 (*) [16])(puVar28 + -3),0x4e);
                  *(undefined1 (*) [16])(puVar28 + -3) = auVar11;
                  auVar44 = ZEXT3264(auVar35);
                }
              }
            }
          }
          if (uVar27 == 0xfffffffffffffff8) {
            return;
          }
          uVar9 = vcmpps_avx512vl(local_2640,auVar44._0_32_,6);
          local_272a.v = (__mmask8)uVar9;
          if (local_272a.v != 0) {
            lVar22 = (ulong)(uVar26 & 0xf) - 8;
            prim = (Primitive_conflict4 *)(uVar27 & 0xfffffffffffffff0);
            while (bVar29 = lVar22 != 0, lVar22 = lVar22 + -1, bVar29) {
              InstanceArrayIntersectorKMB<8>::intersect(&local_272a,&local_2729,ray,local_2728,prim)
              ;
              auVar57 = ZEXT3264(local_2640);
              auVar55 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              prim = prim + 1;
            }
            bVar29 = (bool)(local_272a.v >> 1 & 1);
            bVar3 = (bool)(local_272a.v >> 2 & 1);
            bVar4 = (bool)(local_272a.v >> 3 & 1);
            bVar5 = (bool)(local_272a.v >> 4 & 1);
            bVar6 = (bool)(local_272a.v >> 5 & 1);
            bVar7 = (bool)(local_272a.v >> 6 & 1);
            auVar57 = ZEXT3264(CONCAT428((uint)(local_272a.v >> 7) * *(int *)(ray + 0x11c) |
                                         (uint)!(bool)(local_272a.v >> 7) * auVar57._28_4_,
                                         CONCAT424((uint)bVar7 * *(int *)(ray + 0x118) |
                                                   (uint)!bVar7 * auVar57._24_4_,
                                                   CONCAT420((uint)bVar6 * *(int *)(ray + 0x114) |
                                                             (uint)!bVar6 * auVar57._20_4_,
                                                             CONCAT416((uint)bVar5 *
                                                                       *(int *)(ray + 0x110) |
                                                                       (uint)!bVar5 * auVar57._16_4_
                                                                       ,CONCAT412((uint)bVar4 *
                                                                                  *(int *)(ray + 
                                                  0x10c) | (uint)!bVar4 * auVar57._12_4_,
                                                  CONCAT48((uint)bVar3 * *(int *)(ray + 0x108) |
                                                           (uint)!bVar3 * auVar57._8_4_,
                                                           CONCAT44((uint)bVar29 *
                                                                    *(int *)(ray + 0x104) |
                                                                    (uint)!bVar29 * auVar57._4_4_,
                                                                    (uint)(local_272a.v & 1) *
                                                                    *(int *)(ray + 0x100) |
                                                                    (uint)!(bool)(local_272a.v & 1)
                                                                    * auVar57._0_4_))))))));
            auVar52 = ZEXT3264(local_2660);
            auVar53 = ZEXT3264(local_2680);
            auVar54 = ZEXT3264(local_26a0);
            auVar56 = ZEXT3264(local_26c0);
            auVar58 = ZEXT3264(local_26e0);
            auVar59 = ZEXT3264(local_2700);
            auVar60 = ZEXT3264(local_2720);
          }
        }
        goto LAB_01d17621;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }